

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DemoScripts.cpp
# Opt level: O2

void __thiscall
DemoScripts::TrainSpikingIris(DemoScripts *this,char *path,default_random_engine *generator)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int iVar5;
  int iVar6;
  IDenseNetwork *this_00;
  size_t sVar7;
  ostream *poVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  float fVar12;
  initializer_list<LayerMeta> __l;
  float local_2ac;
  float local_2a8;
  float local_2a4;
  float local_2a0;
  int local_298;
  int local_294;
  int local_290;
  int local_28c;
  vector<float,_std::allocator<float>_> deltas;
  vector<float,_std::allocator<float>_> output;
  undefined **local_228;
  undefined1 local_220 [8];
  SpikeTrainDataset data;
  vector<ILayer_*,_std::allocator<ILayer_*>_> layers;
  _Vector_base<INeuron_*,_std::allocator<INeuron_*>_> local_198;
  vector<LayerMeta,_std::allocator<LayerMeta>_> layersMeta;
  LifSynapseBuilder synapseBuilder;
  Dataset rawData;
  string local_a0 [32];
  undefined8 local_80;
  pointer local_78;
  undefined8 local_70;
  PreciseEventManager eventManager;
  
  layers.super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  layers.super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  layers.super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  LifSynapseBuilder::LifSynapseBuilder(&synapseBuilder,(linear_congruential_engine *)generator);
  local_220 = (undefined1  [8])__gmon_start__;
  local_228 = &PTR_Build_00118d08;
  PreciseEventManager::PreciseEventManager(&eventManager);
  rawData.xTrain.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(rawData.xTrain.
                         super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0x3f800000);
  std::__cxx11::string::string
            ((string *)
             &rawData.xTrain.
              super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish,"input",(allocator *)&data);
  rawData.yTrain.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x4;
  rawData.xTest.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3f800000;
  rawData.xTest.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)CONCAT44(rawData.xTest.
                         super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,0x3f800000);
  rawData.xTest.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_220;
  std::__cxx11::string::string((string *)&rawData.yTest,"hidden2",(allocator *)&output);
  std::__cxx11::string::string(local_a0,"output",(allocator *)&deltas);
  local_80 = 3;
  local_70 = 0x3f8000003f000000;
  __l._M_len = 3;
  __l._M_array = (iterator)&rawData;
  local_78 = (pointer)local_220;
  std::vector<LayerMeta,_std::allocator<LayerMeta>_>::vector
            (&layersMeta,__l,(allocator_type *)&local_198);
  lVar9 = 0x88;
  do {
    std::__cxx11::string::~string
              ((string *)
               ((long)&rawData.xTrain.
                       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar9));
    lVar9 = lVar9 + -0x40;
  } while (lVar9 != -0x38);
  this_00 = IDenseNetworkBuilder::Build
                      ((IDenseNetworkBuilder *)&rawData,&layersMeta,
                       (ISynapseBuilder *)&synapseBuilder,(ILayerBuilder *)&local_228,
                       (IEventManager *)&eventManager,generator,0.0);
  rawData.yTest.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  rawData.yTest.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  rawData.xTest.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  rawData.yTest.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  rawData.xTest.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  rawData.xTest.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  rawData.yTrain.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  rawData.yTrain.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  rawData.xTrain.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  rawData.yTrain.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  rawData.xTrain.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  rawData.xTrain.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  data.yTest.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  data.yTest.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  data.xTest.
  super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  data.yTest.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  data.xTest.
  super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  data.xTest.
  super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  data.yTrain.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  data.yTrain.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  data.xTrain.
  super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  data.yTrain.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  data.xTrain.
  super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  data.xTrain.
  super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::__cxx11::string::string((string *)&output,path,(allocator *)&deltas);
  IRIS::ReadIris((string *)&output,&rawData,0.0);
  std::__cxx11::string::~string((string *)&output);
  DATA_CONVERSION::ConvertDataToSpikeTrains
            (&rawData,&data,(linear_congruential_engine *)generator,200.0);
  for (iVar6 = 0; iVar6 != 100; iVar6 = iVar6 + 1) {
    local_2a8 = 0.0;
    lVar9 = 0;
    uVar10 = 0;
    local_298 = 0;
    iVar11 = 0;
    local_28c = 0;
    local_290 = 0;
    local_294 = 0;
    local_2a4 = 0.0;
    local_2ac = 0.0;
    local_2a0 = 0.0;
    while( true ) {
      if ((ulong)(((long)data.xTrain.
                         super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)data.xTrain.
                        super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= uVar10) break;
      IDenseNetwork::Forward
                (&output,this_00,
                 (SpikeTrain *)
                 ((long)&((data.xTrain.
                           super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + lVar9),200.0,false);
      deltas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      deltas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      deltas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      IDenseNetwork::GetOutputNeurons
                ((vector<INeuron_*,_std::allocator<INeuron_*>_> *)&local_198,this_00);
      fVar12 = NormedCustomLoss2((vector<INeuron_*,_std::allocator<INeuron_*>_> *)&local_198,
                                 data.yTrain.super__Vector_base<float,_std::allocator<float>_>.
                                 _M_impl.super__Vector_impl_data._M_start[uVar10],&deltas);
      std::_Vector_base<INeuron_*,_std::allocator<INeuron_*>_>::~_Vector_base(&local_198);
      sVar7 = GetClassPrediction(&output);
      iVar5 = (int)sVar7;
      local_28c = local_28c + (uint)(iVar5 == 0);
      fVar1 = data.yTrain.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start[uVar10];
      fVar2 = *deltas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      fVar3 = deltas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start[1];
      fVar4 = deltas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start[2];
      IDenseNetwork::Backward(this_00,&deltas);
      IDenseNetwork::GradStep(this_00,1,1e-06,1e-05,10.0,0.0001);
      IDenseNetwork::Reset(this_00);
      local_2a0 = local_2a0 + fVar12;
      local_298 = local_298 + (uint)(iVar5 == -1);
      local_290 = local_290 + (uint)(iVar5 == 1);
      local_294 = local_294 + (uint)(iVar5 == 2);
      iVar11 = iVar11 + (uint)(ABS((float)iVar5 - fVar1) < 0.1);
      local_2a8 = local_2a8 + ABS(fVar2);
      local_2a4 = local_2a4 + ABS(fVar3);
      local_2ac = local_2ac + ABS(fVar4);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&deltas.super__Vector_base<float,_std::allocator<float>_>);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&output.super__Vector_base<float,_std::allocator<float>_>);
      lVar9 = lVar9 + 0x18;
      uVar10 = uVar10 + 1;
    }
    poVar8 = std::operator<<((ostream *)&std::cout,"Loss for epoch: ");
    *(undefined8 *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x10) = 3;
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar6);
    std::operator<<(poVar8," is: ");
    lVar9 = std::cout;
    *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
    *(undefined8 *)(&PreciseEventManager::vtable + *(long *)(lVar9 + -0x18)) = 5;
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar9 + -0x18)) = 9;
    poVar8 = (ostream *)
             std::ostream::operator<<
                       (&std::cout,
                        local_2a0 /
                        (float)(ulong)(((long)data.xTrain.
                                              super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)data.xTrain.
                                             super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start) / 0x18));
    std::operator<<(poVar8," ");
    poVar8 = std::operator<<((ostream *)&std::cout,"Predictions: cetoza-");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_28c);
    poVar8 = std::operator<<(poVar8," versi-");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_290);
    poVar8 = std::operator<<(poVar8," virginica-");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_294);
    std::operator<<(poVar8," ");
    poVar8 = std::operator<<((ostream *)&std::cout,"deltas: cetoza-");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_2a8);
    poVar8 = std::operator<<(poVar8," versi-");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_2a4);
    poVar8 = std::operator<<(poVar8," virginica-");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_2ac);
    std::operator<<(poVar8," ");
    poVar8 = std::operator<<((ostream *)&std::cout,"Accuracy: ");
    poVar8 = (ostream *)
             std::ostream::operator<<
                       (poVar8,(float)iVar11 /
                               (float)(ulong)(((long)data.xTrain.
                                                                                                          
                                                  super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              (long)data.xTrain.
                                                                                                        
                                                  super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) / 0x18)
                       );
    std::operator<<(poVar8," ");
    poVar8 = std::operator<<((ostream *)&std::cout,"Silent samples: ");
    *(undefined8 *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x10) = 3;
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_298);
    std::operator<<(poVar8," | ");
    IDenseNetwork::GetStringStats_abi_cxx11_((string *)&output,this_00);
    std::operator<<((ostream *)&std::cout,(string *)&output);
    std::__cxx11::string::~string((string *)&output);
    IDenseNetwork::ResetStats(this_00);
  }
  if (this_00 != (IDenseNetwork *)0x0) {
    std::_Vector_base<ILayer_*,_std::allocator<ILayer_*>_>::~_Vector_base
              (&(this_00->layers).super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>);
  }
  operator_delete(this_00,0x30);
  SPIKING_NN::SpikeTrainDataset::~SpikeTrainDataset(&data);
  SPIKING_NN::Dataset::~Dataset(&rawData);
  std::vector<LayerMeta,_std::allocator<LayerMeta>_>::~vector(&layersMeta);
  PreciseEventManager::~PreciseEventManager(&eventManager);
  std::_Vector_base<ILayer_*,_std::allocator<ILayer_*>_>::~_Vector_base
            (&layers.super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>);
  return;
}

Assistant:

void DemoScripts::TrainSpikingIris( char *path, std::default_random_engine &generator )
{
    float EPS = 1e-1;
    float LEARNING_RATE_V = 0.000001;
    float LEARNING_RATE_W = 0.00001;
    float SIMULATION_TIME = 200;

    size_t IRIS_INPUT = 4;
    size_t IRIS_OUTPUT = 3;

    int BATCH_SIZE = 1;

    const float ALPHA = 0.05;
    const float BETA = 10;
    const float LAMBDA = 0.0001;


    std::vector<ILayer *> layers;
    LifSynapseBuilder synapseBuilder = LifSynapseBuilder( generator );
    LifNeuronBuilder neuronBuilder = LifNeuronBuilder();
    DenseLifLayerBuilder layerBuilder = DenseLifLayerBuilder();
    PreciseEventManager eventManager = PreciseEventManager();


    std::vector<LayerMeta> layersMeta = {
            {1,   "input",   IRIS_INPUT,  neuronBuilder, 1,   0},
            {1,   "hidden2", 6,           neuronBuilder, 2,   1},
            {0.5, "output",  IRIS_OUTPUT, neuronBuilder, 0.5, 1}
    };

    auto network = IDenseNetworkBuilder().Build( layersMeta, synapseBuilder, layerBuilder, eventManager,
                                                 generator, 0 );

    SPIKING_NN::Dataset rawData;
    SPIKING_NN::SpikeTrainDataset data;
    IRIS::ReadIris( path, rawData, 0 );
    DATA_CONVERSION::ConvertDataToSpikeTrains( rawData, data, generator, SIMULATION_TIME );

    for ( int epochId = 0; epochId < 100; epochId++ ) {
        float totalLoss = 0.f;
        int silentSamples = 0;
        int guesses = 0;
        int cetozaCnt = 0;
        int versiCnt = 0;
        int virginicaCnt = 0;
        float cetozaDelta = 0;
        float versiDelta = 0;
        float viriginicaDelta = 0;

        for ( int sampleId = 0; sampleId < data.xTrain.size(); sampleId++ ) {
            std::vector<float> output = network->Forward( data.xTrain[sampleId], SIMULATION_TIME, false );

            std::vector<float> deltas;
            float loss = NormedCustomLoss2( network->GetOutputNeurons(), data.yTrain[sampleId], deltas );
            totalLoss += loss;
            int predictedClassId = GetClassPrediction( output );
            silentSamples += predictedClassId == -1 ? 1 : 0;
            cetozaCnt += predictedClassId == 0 ? 1 : 0;
            versiCnt += predictedClassId == 1 ? 1 : 0;
            virginicaCnt += predictedClassId == 2 ? 1 : 0;
            int guess = abs((float) predictedClassId - data.yTrain[sampleId] ) < EPS;
            guesses += guess;
            cetozaDelta += abs( deltas[0] );
            versiDelta += abs( deltas[1] );
            viriginicaDelta += abs( deltas[2] );

            network->Backward( deltas );

            if (( sampleId + 1 ) % BATCH_SIZE == 0 ) {
                network->GradStep( BATCH_SIZE, LEARNING_RATE_V, LEARNING_RATE_W, BETA, LAMBDA );
            }
            network->Reset();
        }
        std::cout << "Loss for epoch: " << std::setw( 3 ) << epochId << " is: ";
        std::cout << std::fixed << std::setprecision( 5 ) << std::setw( 9 ) << totalLoss / data.xTrain.size() << " ";
        std::cout << "Predictions: cetoza-" << cetozaCnt << " versi-" << versiCnt << " virginica-" << virginicaCnt
                  << " ";
        std::cout << "deltas: cetoza-" << cetozaDelta << " versi-" << versiDelta << " virginica-" << viriginicaDelta
                  << " ";
        std::cout << "Accuracy: " << (float) guesses / data.xTrain.size() << " ";
        std::cout << "Silent samples: " << std::setw( 3 ) << silentSamples << " | ";
        std::cout << network->GetStringStats();
        network->ResetStats();
    }
    delete network;
}